

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary_gnu_ds(arg_dstr_t ds,void **argtable)

{
  byte *pbVar1;
  char *__s;
  ushort *puVar2;
  size_t sVar3;
  ushort **ppuVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  uint local_f8 [50];
  
  lVar6 = 0;
  while( true ) {
    pbVar1 = (byte *)argtable[lVar6];
    if ((*pbVar1 & 1) != 0) {
      arg_dstr_cat(ds,"\n");
      return;
    }
    if (*(long *)(pbVar1 + 0x20) != 0) break;
LAB_00109e58:
    lVar6 = lVar6 + 1;
  }
  memset(local_f8,0,200);
  if (*(char **)(pbVar1 + 0x10) != (char *)0x0 && *(size_t *)(pbVar1 + 8) == 0) {
    local_f8[0] = 0x20202020;
  }
  __s = *(char **)(pbVar1 + 0x20);
  arg_cat_optionv((char *)local_f8,*(size_t *)(pbVar1 + 8),*(char **)(pbVar1 + 0x10),
                  *(char **)(pbVar1 + 0x18),(char *)(ulong)(*pbVar1 & 4),0x110954,(char *)argtable);
  sVar3 = strlen((char *)local_f8);
  if (0x19 < sVar3) {
    arg_dstr_catf(ds,"  %-25s %s\n",local_f8,"");
    local_f8[0] = local_f8[0] & 0xffffff00;
  }
  arg_dstr_catf(ds,"  %-25s ",local_f8);
  sVar3 = strlen(__s);
  if (0xfffffffe < sVar3) {
    __assert_fail("strlen(text) < UINT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/argtable3/src/argtable3.c"
                  ,899,
                  "void arg_print_formatted_ds(arg_dstr_t, const unsigned int, const unsigned int, const char *)"
                 );
  }
  uVar11 = 0;
  do {
    uVar9 = sVar3 & 0xffffffff;
    do {
      uVar7 = (uint)uVar11;
      if ((uint)uVar9 <= uVar7) goto LAB_00109e58;
      ppuVar4 = __ctype_b_loc();
      puVar2 = *ppuVar4;
      uVar11 = (ulong)(uVar7 - 1);
      uVar7 = uVar7 + 0x35;
      do {
        uVar5 = uVar7;
        iVar8 = (int)uVar11;
        uVar10 = iVar8 + 1;
        uVar11 = (ulong)uVar10;
        uVar7 = uVar5 + 1;
      } while ((*(byte *)((long)puVar2 + (long)__s[uVar11] * 2 + 1) & 0x20) != 0);
      if (0x34 < (uint)uVar9 - uVar10) {
        uVar7 = iVar8 + 0x35;
        while ((uVar10 < uVar7 && ((*(byte *)((long)puVar2 + (long)__s[uVar7] * 2 + 1) & 0x20) == 0)
               )) {
          uVar7 = uVar7 - 1;
          uVar5 = uVar5 - 1;
        }
        do {
          uVar9 = (ulong)uVar5;
          uVar5 = uVar5 - 1;
          if (uVar5 <= uVar10) break;
        } while ((*(byte *)((long)puVar2 + (long)__s[uVar5] * 2 + 1) & 0x20) != 0);
      }
      for (; uVar11 < uVar9; uVar11 = uVar11 + 1) {
        arg_dstr_catc(ds,__s[uVar11]);
      }
      arg_dstr_cat(ds,"\n");
    } while ((uint)sVar3 <= (uint)uVar9);
    iVar8 = 0x1c;
    while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
      arg_dstr_cat(ds," ");
    }
  } while( true );
}

Assistant:

void arg_print_glossary_gnu_ds(arg_dstr_t ds, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;

            if (!shortopts && longopts) {
                /* Indent trailing line by 4 spaces... */
                memset(syntax, ' ', 4);
                *(syntax + 4) = '\0';
            }

            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");

            /* If syntax fits not into column, print glossary in new line... */
            if (strlen(syntax) > 25) {
                arg_dstr_catf(ds, "  %-25s %s\n", syntax, "");
                *syntax = '\0';
            }

            arg_dstr_catf(ds, "  %-25s ", syntax);
            arg_print_formatted_ds(ds, 28, 79, glossary);
        }
    } /* for each table entry */

    arg_dstr_cat(ds, "\n");
}